

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O1

void linenoiseEditDelete(linenoiseState *l)

{
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  
  uVar1 = l->len;
  if ((uVar1 != 0) && (uVar2 = l->pos, uVar2 < uVar1)) {
    memmove(l->buf + uVar2,l->buf + uVar2 + 1,uVar1 + ~uVar2);
    sVar3 = l->len;
    l->len = sVar3 - 1;
    l->buf[sVar3 - 1] = '\0';
    refreshLine(l);
    return;
  }
  return;
}

Assistant:

void linenoiseEditDelete(struct linenoiseState *l) {
	if (l->len > 0 && l->pos < l->len) {
		memmove(l->buf+l->pos,l->buf+l->pos+1,l->len-l->pos-1);
		l->len--;
		l->buf[l->len] = '\0';
		refreshLine(l);
	}
}